

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O0

double brotli::BitsEntropy(uint32_t *population,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double local_28;
  double retval;
  size_t sum;
  size_t size_local;
  uint32_t *population_local;
  undefined4 uVar3;
  
  sum = size;
  size_local = (size_t)population;
  local_28 = ShannonEntropy(population,size,(size_t *)&retval);
  uVar3 = (undefined4)((ulong)retval >> 0x20);
  auVar1._8_4_ = uVar3;
  auVar1._0_8_ = retval;
  auVar1._12_4_ = 0x45300000;
  if (local_28 <
      (auVar1._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
    auVar2._8_4_ = uVar3;
    auVar2._0_8_ = retval;
    auVar2._12_4_ = 0x45300000;
    local_28 = (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0);
  }
  return local_28;
}

Assistant:

static inline double BitsEntropy(const uint32_t *population, size_t size) {
  size_t sum;
  double retval = ShannonEntropy(population, size, &sum);
  if (retval < sum) {
    // At least one bit per literal is needed.
    retval = static_cast<double>(sum);
  }
  return retval;
}